

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512fp16.cpp
# Opt level: O0

void ncnn::cast_fp16_to_fp32_sse_avx512fp16(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Option *in_stack_00000210;
  Mat *in_stack_00000218;
  Mat *in_stack_00000220;
  
  cast_fp16_to_fp32_sse(in_stack_00000220,in_stack_00000218,in_stack_00000210);
  return;
}

Assistant:

void cast_fp16_to_fp32_sse_avx512fp16(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
}